

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O3

int check_next2(LexState *ls,char *set)

{
  size_t sVar1;
  int c;
  ZIO *z;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  
  if (set[2] == '\0') {
    c = ls->current;
    if ((c == *set) || (iVar3 = 0, c == set[1])) {
      save(ls,c);
      z = ls->z;
      sVar1 = z->n;
      z->n = z->n - 1;
      if (sVar1 == 0) {
        uVar4 = luaZ_fill(z);
      }
      else {
        pbVar2 = (byte *)z->p;
        z->p = (char *)(pbVar2 + 1);
        uVar4 = (uint)*pbVar2;
      }
      ls->current = uVar4;
      iVar3 = 1;
    }
    return iVar3;
  }
  __assert_fail("set[2] == \'\\0\'",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                ,0xdb,"int check_next2(LexState *, const char *)");
}

Assistant:

static int check_next2 (LexState *ls, const char *set) {
  lua_assert(set[2] == '\0');
  if (ls->current == set[0] || ls->current == set[1]) {
    save_and_next(ls);
    return 1;
  }
  else return 0;
}